

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::SPxBasisBase<double>::writeBasis
          (SPxBasisBase<double> *this,ostream *os,NameSet *rowNames,NameSet *colNames,bool cpxFormat
          )

{
  Status SVar1;
  uint uVar2;
  int iVar3;
  Item *pIVar4;
  char cVar5;
  int iVar6;
  Type TVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  SPxSolverBase<double> *this_00;
  uint i;
  uint uVar12;
  char *unaff_R14;
  char buf [255];
  DataKey local_148;
  SPxRowId local_140;
  char local_138 [264];
  
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(os,"NAME  soplex.bas\n",0x11);
  cVar5 = (char)os;
  if (this->thestatus == NO_PROBLEM) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"ENDATA",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    return;
  }
  this_00 = this->theLP;
  if (0 < (this_00->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      SVar1 = (this->thedesc).colstat.data[lVar9];
      iVar6 = (int)os;
      if (SVar1 < D_FREE) {
        if (SVar1 == P_ON_UPPER) {
          std::__ostream_insert<char,std::char_traits<char>>(os," UL ",4);
          pcVar11 = getColName<double>(&this->theLP->super_SPxLPBase<double>,(int)lVar9,colNames,
                                       local_138);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar8 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,sVar8);
            unaff_R14 = pcVar11;
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
        }
      }
      else {
        uVar2 = (this_00->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                super_SVSetBase<double>.set.thenum;
        i = uVar12;
        if ((int)uVar12 < (int)uVar2) {
          lVar10 = 0;
          do {
            if ((this->thedesc).rowstat.data[(int)uVar12 + lVar10] < ~P_FREE) {
              i = uVar12 + (int)lVar10;
              break;
            }
            lVar10 = lVar10 + 1;
            i = uVar2;
          } while ((long)(int)uVar2 - (long)(int)uVar12 != lVar10);
        }
        if ((this->thedesc).rowstat.data[(int)i] == P_ON_UPPER) {
          pcVar11 = " XU ";
          if (cpxFormat) {
            TVar7 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this_00,i);
            pcVar11 = " XU ";
            if (TVar7 != RANGE) goto LAB_001c5086;
          }
        }
        else {
LAB_001c5086:
          pcVar11 = " XL ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,4);
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
        pcVar11 = getColName<double>(&this->theLP->super_SPxLPBase<double>,(int)lVar9,colNames,
                                     local_138);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar8 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,sVar8);
          unaff_R14 = pcVar11;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"       ",7);
        if (rowNames == (NameSet *)0x0) {
LAB_001c5155:
          unaff_R14 = local_138;
          spxSnprintf(unaff_R14,0x10,"C%d",(ulong)i);
        }
        else {
          local_148 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thekey[(int)i];
          SPxRowId::SPxRowId(&local_140,&local_148);
          pIVar4 = (rowNames->set).theitem;
          iVar3 = pIVar4[local_140.super_DataKey.idx].info;
          if (-1 < iVar3) {
            unaff_R14 = rowNames->mem + pIVar4[local_140.super_DataKey.idx].data;
          }
          if (iVar3 < 0) goto LAB_001c5155;
        }
        if (unaff_R14 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar8 = strlen(unaff_R14);
          std::__ostream_insert<char,std::char_traits<char>>(os,unaff_R14,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        uVar12 = i + 1;
      }
      lVar9 = lVar9 + 1;
      this_00 = this->theLP;
    } while (lVar9 < (this_00->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"ENDATA",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  return;
}

Assistant:

void SPxBasisBase<R>::writeBasis(
   std::ostream&  os,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool cpxFormat
) const
{
   assert(theLP != nullptr);

   os.setf(std::ios::left);
   os << "NAME  soplex.bas\n";

   /* do not write basis if there is none */
   if(status() == NO_PROBLEM)
   {
      os << "ENDATA" << std::endl;
      return;
   }

   /* start writing */
   char buf[255];
   int row = 0;

   for(int col = 0; col < theLP->nCols(); col++)
   {
      if(thedesc.colStatus(col) > 0)
      {
         /* Find non basic row */
         for(; row < theLP->nRows(); row++)
         {
            if(thedesc.rowStatus(row) < 0)
               break;
         }

         assert(row != theLP->nRows());

         if(thedesc.rowStatus(row) == Desc::P_ON_UPPER && (!cpxFormat
               || theLP->LPRowSetBase<R>::type(row) == LPRowBase<R>::RANGE))
            os << " XU ";
         else
            os << " XL ";

         os << std::setw(8) << getColName(theLP, col, colNames, buf);

         /* break in two parts since buf is reused */
         os << "       "
            << getRowName(theLP, row, rowNames, buf)
            << std::endl;

         row++;
      }
      else
      {
         if(thedesc.colStatus(col) == Desc::P_ON_UPPER)
         {
            os << " UL "
               << getColName(theLP, col, colNames, buf)
               << std::endl;
         }
         else
         {
            /* Default is all non-basic variables on lower bound (if finite) or at zero (if free).
             * nothing to do in this case.
             */
            assert(thedesc.colStatus(col) == Desc::P_ON_LOWER
                   || thedesc.colStatus(col) == Desc::P_FIXED
                   || thedesc.colStatus(col) == Desc::P_FREE);
            assert(thedesc.colStatus(col) == Desc::P_FREE || theLP->lower(col) > R(-infinity));
            assert(thedesc.colStatus(col) != Desc::P_FREE || theLP->lower(col) <= 0);
         }
      }
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());

   // Check that we covered all nonbasic rows - the remaining should be basic.
   for(; row < theLP->nRows(); row++)
   {
      if(thedesc.rowStatus(row) < 0)
         break;
   }

   assert(row == theLP->nRows());

#endif // NDEBUG

   os << "ENDATA" << std::endl;
}